

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

char * lyd_get_unique_default(char *unique_expr,lyd_node *list)

{
  uint uVar1;
  lys_node **pplVar2;
  lys_node *plVar3;
  lyd_node *plVar4;
  lyd_node *plVar5;
  int iVar6;
  ly_set *set;
  ly_set *set_00;
  lyd_node **pplVar7;
  LY_ERR *pLVar8;
  lyd_node *plVar9;
  uint uVar10;
  lys_module *local_40;
  lyd_node *node;
  uint uVar11;
  
  if (unique_expr == (char *)0x0) {
    __assert_fail("unique_expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x1366,"const char *lyd_get_unique_default(const char *, struct lyd_node *)");
  }
  iVar6 = resolve_descendant_schema_nodeid(unique_expr,list->schema->child,4,1,1,(lys_node **)&node)
  ;
  plVar5 = node;
  if (iVar6 != 0 || node == (lyd_node *)0x0) {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,0x136a);
    return (char *)0x0;
  }
  plVar9 = node[3].next;
  if (plVar9 == (lyd_node *)0x0) {
    if (((ulong)node->next & 0x40) == 0) {
      pplVar7 = &node[2].prev;
      plVar9 = (lyd_node *)0x0;
      while ((plVar4 = *pplVar7, plVar4 != (lyd_node *)0x0 && (plVar9 == (lyd_node *)0x0))) {
        pplVar7 = &plVar4[1].next;
        plVar9 = *(lyd_node **)&plVar4[2].validity;
      }
      if (plVar9 != (lyd_node *)0x0) goto LAB_0015c17e;
    }
    plVar9 = (lyd_node *)0x0;
  }
  else {
LAB_0015c17e:
    set = ly_set_new();
    for (node = (lyd_node *)lys_parent((lys_node *)node); (lys_node *)node != list->schema;
        node = (lyd_node *)lys_parent((lys_node *)node)) {
      if ((((lys_node *)node)->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE|LYS_CONTAINER)) ==
          LYS_UNKNOWN) {
        pLVar8 = ly_errno_location();
        *pLVar8 = LY_EINT;
        plVar9 = (lyd_node *)0x0;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0x1382);
        goto LAB_0015c38f;
      }
      ly_set_add(set,node,1);
    }
    ly_vlog_hide('\x01');
    uVar10 = 0;
    while (uVar1 = set->number, uVar10 < uVar1) {
      pplVar2 = (set->set).s;
      plVar3 = pplVar2[uVar10];
      uVar11 = uVar10;
      if (plVar3->nodetype == LYS_CHOICE) {
        if ((lys_node *)list == (lys_node *)0x0) {
          list = (lyd_node *)0x0;
        }
        else {
          uVar11 = uVar10 + 1;
          node = plVar5;
          if ((((uVar11 == uVar1) ||
               (node = (lyd_node *)pplVar2[uVar11], ((lys_node *)node)->nodetype != LYS_CASE)) ||
              (uVar1 <= uVar10 + 2)) || (pplVar2[uVar10 + 2]->nodetype != LYS_CHOICE)) {
            local_40 = ((lys_node *)list)->module;
            iVar6 = lyv_multicases((lyd_node *)0x0,(lys_node *)node,(lyd_node **)&local_40,0,
                                   (lyd_node *)0x0);
            uVar11 = uVar10;
            plVar3 = (lys_node *)node;
            if (iVar6 != 0) {
              ly_err_clean(1);
              goto LAB_0015c386;
            }
          }
        }
      }
      else if (plVar3->nodetype == LYS_CONTAINER) {
        node = (lyd_node *)plVar3;
        if ((lys_node *)list == (lys_node *)0x0) {
          list = (lyd_node *)0x0;
        }
        else {
          set_00 = lyd_find_xpath(list,plVar3->name);
          if ((set_00 == (ly_set *)0x0) || (1 < set_00->number)) {
            ly_set_free(set_00);
            pLVar8 = ly_errno_location();
            *pLVar8 = LY_EINT;
            plVar9 = (lyd_node *)0x0;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                   ,0x1393);
            break;
          }
          if (set_00->number == 0) {
            list = (lyd_node *)0x0;
          }
          else {
            list = (lyd_node *)*(set_00->set).s;
          }
          ly_set_free(set_00);
        }
        plVar3 = (lys_node *)node;
        if (node[2].attr != (lyd_attr *)0x0) {
LAB_0015c386:
          plVar9 = (lyd_node *)0x0;
          break;
        }
      }
      node = (lyd_node *)plVar3;
      uVar10 = uVar11 + 1;
    }
    ly_vlog_hide('\0');
LAB_0015c38f:
    ly_set_free(set);
  }
  return (char *)plVar9;
}

Assistant:

const char *
lyd_get_unique_default(const char* unique_expr, struct lyd_node *list)
{
    const struct lys_node *parent;
    const struct lys_node_leaf *sleaf = NULL;
    struct lys_tpdf *tpdf;
    struct lyd_node *last, *node;
    const char *dflt = NULL;
    struct ly_set *s, *r;
    unsigned int i;

    assert(unique_expr);

    if (resolve_descendant_schema_nodeid(unique_expr, list->schema->child, LYS_LEAF, 1, 1, &parent) || !parent) {
        /* error, but unique expression was checked when the schema was parsed so this should not happened */
        LOGINT;
        return NULL;
    }

    sleaf = (struct lys_node_leaf *)parent;
    if (sleaf->dflt) {
        /* leaf has a default value */
        dflt = sleaf->dflt;
    } else if (!(sleaf->flags & LYS_MAND_TRUE)) {
        /* get the default value from the type */
        for (tpdf = sleaf->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
            dflt = tpdf->dflt;
        }
    }

    if (!dflt) {
        return NULL;
    }

    /* it has default value, but check if it can appear in the data tree under the list */
    s = ly_set_new();
    for (parent = lys_parent((struct lys_node *)sleaf); parent != list->schema; parent = lys_parent(parent)) {
        if (!(parent->nodetype & (LYS_CONTAINER | LYS_CASE | LYS_CHOICE | LYS_USES))) {
            /* This should be already detected when parsing schema */
            LOGINT;
            ly_set_free(s);
            return NULL;
        }
        ly_set_add(s, (void *)parent, LY_SET_OPT_USEASLIST);
    }
    ly_vlog_hide(1);
    for (i = 0, last = list; i < s->number; i++) {
        parent = s->set.s[i]; /* shortcut */

        switch (parent->nodetype) {
        case LYS_CONTAINER:
            if (last) {
                /* find instance in the data */
                r = lyd_find_xpath(last, parent->name);
                if (!r || r->number > 1) {
                    ly_set_free(r);
                    LOGINT;
                    dflt = NULL;
                    goto end;
                }
                if (r->number) {
                    last = r->set.d[0];
                } else {
                    last = NULL;
                }
                ly_set_free(r);
            }
            if (((struct lys_node_container *)parent)->presence) {
                /* not-instantiated presence container on path */
                dflt = NULL;
                goto end;
            }
            break;
        case LYS_CHOICE :
            /* check presence of another case */
            if (!last) {
                continue;
            }

            /* remember the case to be searched in choice by lyv_multicases() */
            if (i + 1 == s->number) {
                parent = (struct lys_node *)sleaf;
            } else if (s->set.s[i + 1]->nodetype == LYS_CASE && (i + 2 < s->number) &&
                    s->set.s[i + 2]->nodetype == LYS_CHOICE) {
                /* nested choices are covered by lyv_multicases, we just have to pass
                 * the lowest choice */
                i++;
                continue;
            } else {
                parent = s->set.s[i + 1];
            }
            node = last->child;
            if (lyv_multicases(NULL, (struct lys_node *)parent, &node, 0, NULL)) {
                /* another case is present */
                ly_err_clean(1);
                dflt = NULL;
                goto end;
            }
            break;
        default:
            /* LYS_CASE, LYS_USES */
            continue;
        }
    }

end:
    ly_vlog_hide(0);
    ly_set_free(s);
    return dflt;
}